

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     local_scan<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::plus<unsigned_long>>
               (long *begin,long *end,long *out)

{
  long lVar1;
  
  if (end != begin) {
    lVar1 = *begin;
    while( true ) {
      *out = lVar1;
      begin = begin + 1;
      out = out + 1;
      if (begin == end) break;
      lVar1 = lVar1 + *begin;
    }
  }
  return;
}

Assistant:

void local_scan(InIterator begin, InIterator end, OutIterator out, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<OutIterator>::value_type T;

    // start from first element
    T val = *begin;
    *out = *begin;
    ++begin;
    ++out;

    // calculate the inclusive prefix sum
    while (begin != end) {
        val = func(val,*begin);
        *out = val;
        ++begin;
        ++out;
    }
}